

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::IGXMLScanner::endElementPSVI
          (IGXMLScanner *this,SchemaElementDecl *elemDecl,DatatypeValidator *memberDV)

{
  int *piVar1;
  ComplexTypeInfo *key;
  XMLCh *pXVar2;
  PSVIElement *this_00;
  QName *pQVar3;
  PSVIHandler *pPVar4;
  XMLStringPool *pXVar5;
  int iVar6;
  undefined4 extraout_var;
  XSElementDeclaration *elemDecl_00;
  XSSimpleTypeDefinition *memberType;
  undefined4 extraout_var_00;
  ASSESSMENT_TYPE assessmentType;
  DatatypeValidator *pDVar7;
  XMLCh *canonicalValue;
  VALIDITY_STATE validityState;
  bool bVar8;
  XSTypeDefinition *local_50;
  
  iVar6 = (this->fPSVIElemContext).fElemDepth;
  assessmentType = VALIDATION_FULL;
  if ((iVar6 <= (this->fPSVIElemContext).fFullValidationDepth) &&
     (assessmentType = VALIDATION_NONE, iVar6 <= (this->fPSVIElemContext).fNoneValidationDepth)) {
    (this->fPSVIElemContext).fNoneValidationDepth = iVar6 + -1;
    (this->fPSVIElemContext).fFullValidationDepth = iVar6 + -1;
    assessmentType = VALIDATION_PARTIAL;
  }
  validityState = VALIDITY_NOTKNOWN;
  if (((this->super_XMLScanner).fValidate == true) &&
     (validityState = VALIDITY_NOTKNOWN, (elemDecl->super_XMLElementDecl).fCreateReason == Declared)
     ) {
    validityState = VALIDITY_VALID - (this->fPSVIElemContext).fErrorOccurred;
  }
  key = (this->fPSVIElemContext).fCurrentTypeInfo;
  if (key == (ComplexTypeInfo *)0x0) {
    pDVar7 = (this->fPSVIElemContext).fCurrentDV;
    bVar8 = true;
    if (pDVar7 == (DatatypeValidator *)0x0) {
      local_50 = (XSTypeDefinition *)0x0;
    }
    else {
      local_50 = (XSTypeDefinition *)XSModel::getXSObject(this->fModel,pDVar7);
    }
  }
  else {
    local_50 = (XSTypeDefinition *)XSModel::getXSObject(this->fModel,key);
    bVar8 = (((this->fPSVIElemContext).fCurrentTypeInfo)->fContentType & 0xfffffffeU) != 2;
  }
  pXVar2 = (this->fPSVIElemContext).fNormalizedValue;
  canonicalValue = (XMLCh *)0x0;
  if (((pXVar2 != (XMLCh *)0x0) && (bVar8)) && (validityState == VALIDITY_VALID)) {
    pDVar7 = memberDV;
    if ((memberDV == (DatatypeValidator *)0x0) &&
       (pDVar7 = (this->fPSVIElemContext).fCurrentDV, pDVar7 == (DatatypeValidator *)0x0)) {
      canonicalValue = (XMLCh *)0x0;
    }
    else {
      iVar6 = (*(pDVar7->super_XSerializable)._vptr_XSerializable[7])
                        (pDVar7,pXVar2,(this->super_XMLScanner).fMemoryManager,0);
      canonicalValue = (XMLCh *)CONCAT44(extraout_var,iVar6);
    }
  }
  this_00 = this->fPSVIElement;
  pXVar2 = (this->super_XMLScanner).fRootElemName;
  bVar8 = (this->fPSVIElemContext).fIsSpecified;
  if ((elemDecl->super_XMLElementDecl).fCreateReason == Declared) {
    elemDecl_00 = (XSElementDeclaration *)XSModel::getXSObject(this->fModel,elemDecl);
  }
  else {
    elemDecl_00 = (XSElementDeclaration *)0x0;
  }
  if (memberDV == (DatatypeValidator *)0x0) {
    memberType = (XSSimpleTypeDefinition *)0x0;
  }
  else {
    memberType = (XSSimpleTypeDefinition *)XSModel::getXSObject(this->fModel,memberDV);
  }
  PSVIElement::reset(this_00,validityState,assessmentType,pXVar2,bVar8,elemDecl_00,local_50,
                     memberType,this->fModel,elemDecl->fDefaultValue,
                     (this->fPSVIElemContext).fNormalizedValue,canonicalValue,
                     (XSNotationDeclaration *)0x0);
  pQVar3 = (elemDecl->super_XMLElementDecl).fElementName;
  pXVar2 = pQVar3->fLocalPart;
  pPVar4 = (this->super_XMLScanner).fPSVIHandler;
  pXVar5 = (this->super_XMLScanner).fURIStringPool;
  iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)pQVar3->fURIId);
  (*pPVar4->_vptr_PSVIHandler[2])(pPVar4,pXVar2,CONCAT44(extraout_var_00,iVar6),this->fPSVIElement);
  piVar1 = &(this->fPSVIElemContext).fElemDepth;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void IGXMLScanner::endElementPSVI(SchemaElementDecl* const elemDecl,
                                  DatatypeValidator* const memberDV)
{
    PSVIElement::ASSESSMENT_TYPE validationAttempted;
    PSVIElement::VALIDITY_STATE validity = PSVIElement::VALIDITY_NOTKNOWN;

    if (fPSVIElemContext.fElemDepth > fPSVIElemContext.fFullValidationDepth)
        validationAttempted = PSVIElement::VALIDATION_FULL;
    else if (fPSVIElemContext.fElemDepth > fPSVIElemContext.fNoneValidationDepth)
        validationAttempted = PSVIElement::VALIDATION_NONE;
    else
    {
        validationAttempted  = PSVIElement::VALIDATION_PARTIAL;
		fPSVIElemContext.fFullValidationDepth =
            fPSVIElemContext.fNoneValidationDepth = fPSVIElemContext.fElemDepth - 1;
    }

    if (fValidate && elemDecl->isDeclared())
    {
        validity = (fPSVIElemContext.fErrorOccurred)
            ? PSVIElement::VALIDITY_INVALID : PSVIElement::VALIDITY_VALID;
    }

    XSTypeDefinition* typeDef = 0;
    bool isMixed = false;
    if (fPSVIElemContext.fCurrentTypeInfo)
    {
        typeDef = (XSTypeDefinition*) fModel->getXSObject(fPSVIElemContext.fCurrentTypeInfo);
        SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes)fPSVIElemContext.fCurrentTypeInfo->getContentType();
        isMixed = (modelType == SchemaElementDecl::Mixed_Simple
                || modelType == SchemaElementDecl::Mixed_Complex);
    }
    else if (fPSVIElemContext.fCurrentDV)
        typeDef = (XSTypeDefinition*) fModel->getXSObject(fPSVIElemContext.fCurrentDV);

    XMLCh* canonicalValue = 0;
    if (fPSVIElemContext.fNormalizedValue && !isMixed &&
            validity == PSVIElement::VALIDITY_VALID)
    {
        if (memberDV)
            canonicalValue = (XMLCh*) memberDV->getCanonicalRepresentation(fPSVIElemContext.fNormalizedValue, fMemoryManager);
        else if (fPSVIElemContext.fCurrentDV)
            canonicalValue = (XMLCh*) fPSVIElemContext.fCurrentDV->getCanonicalRepresentation(fPSVIElemContext.fNormalizedValue, fMemoryManager);
    }

    fPSVIElement->reset
    (
        validity
        , validationAttempted
        , fRootElemName
        , fPSVIElemContext.fIsSpecified
        , (elemDecl->isDeclared())
            ? (XSElementDeclaration*) fModel->getXSObject(elemDecl) : 0
        , typeDef
        , (memberDV) ? (XSSimpleTypeDefinition*) fModel->getXSObject(memberDV) : 0
        , fModel
        , elemDecl->getDefaultValue()
        , fPSVIElemContext.fNormalizedValue
        , canonicalValue
    );

    fPSVIHandler->handleElementPSVI
    (
        elemDecl->getBaseName()
        , fURIStringPool->getValueForId(elemDecl->getURI())
        , fPSVIElement
    );

    // decrease element depth
    fPSVIElemContext.fElemDepth--;

}